

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

bool Js::BinarySearchForLocale<&unum_getAvailable_70,&unum_countAvailable_70>(char *localeID)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  char *__s2;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  
  iVar3 = unum_countAvailable_70();
  iVar10 = iVar3 + -1;
  if (iVar10 < 0) {
    uVar9 = 1;
  }
  else {
    iVar7 = 0;
    uVar9 = 1;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    iVar8 = iVar10;
    do {
      iVar11 = iVar7 + iVar8;
      iVar6 = iVar11 / 2;
      if (iVar11 < -1 || iVar3 <= iVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x3ec,"(i >= 0 && i < count)","i >= 0 && i < count");
        if (!bVar2) goto LAB_00b5bb44;
        *puVar4 = 0;
      }
      __s2 = (char *)unum_getAvailable_70(iVar6);
      if (1 < iVar11) {
        pcVar5 = (char *)unum_getAvailable_70(iVar6 + -1);
        iVar11 = strcmp(pcVar5,__s2);
        if (-1 < iVar11) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x3f1,
                                      "(i > 0 ? strcmp(GetAvailableLocalesFunc(i - 1), cur) < 0 : true)"
                                      ,
                                      "i > 0 ? strcmp(GetAvailableLocalesFunc(i - 1), cur) < 0 : true"
                                     );
          if (!bVar2) goto LAB_00b5bb44;
          *puVar4 = 0;
        }
      }
      if (iVar6 < iVar10) {
        pcVar5 = (char *)unum_getAvailable_70(iVar6 + 1);
        iVar11 = strcmp(pcVar5,__s2);
        if (iVar11 < 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x3f2,
                                      "(i < count - 1 ? strcmp(GetAvailableLocalesFunc(i + 1), cur) > 0 : true)"
                                      ,
                                      "i < count - 1 ? strcmp(GetAvailableLocalesFunc(i + 1), cur) > 0 : true"
                                     );
          if (!bVar2) {
LAB_00b5bb44:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
      }
      iVar11 = strcmp(localeID,__s2);
      if (iVar11 == 0) {
        Output::Trace(IntlPhase,L"%S(): Found localeID %S in %d iterations\n",
                      "BinarySearchForLocale",localeID,(ulong)uVar9);
        return true;
      }
      if (iVar11 < 0) {
        iVar8 = iVar6 + -1;
      }
      else {
        iVar7 = iVar6 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (iVar7 <= iVar8);
  }
  Output::Trace(IntlPhase,L"%S(): Could not find localeID %S in %d iterations\n",
                "BinarySearchForLocale",localeID,(ulong)uVar9);
  return false;
}

Assistant:

static bool BinarySearchForLocale(const char *localeID)
    {
        const int count = CountAvailableLocalesFunc();
        int left = 0;
        int right = count - 1;
        int iterations = 0;
        while (true)
        {
            iterations += 1;
            if (left > right)
            {
                INTL_TRACE("Could not find localeID %S in %d iterations", localeID, iterations);
                return false;
            }

            int i = (left + right) / 2;
            Assert(i >= 0 && i < count);

            const char *cur = GetAvailableLocalesFunc(i);

            // Ensure that this list is actually binary searchable
            Assert(i > 0 ? strcmp(GetAvailableLocalesFunc(i - 1), cur) < 0 : true);
            Assert(i < count - 1 ? strcmp(GetAvailableLocalesFunc(i + 1), cur) > 0 : true);

            int res = strcmp(localeID, cur);
            if (res == 0)
            {
                INTL_TRACE("Found localeID %S in %d iterations", localeID, iterations);
                return true;
            }
            else if (res < 0)
            {
                right = i - 1;
            }
            else
            {
                left = i + 1;
            }
        }
    }